

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O3

bool RunCommand(char *comment,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *command,bool verbose,NumberFormat exitFormat,int *retCodeOut,
               _func_bool_int *retCodeOkay)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  undefined7 in_register_00000011;
  int retCode;
  string output;
  int local_84;
  string local_80;
  NumberFormat local_5c;
  string local_58;
  NumberFormatter local_38;
  
  local_5c = exitFormat;
  if ((int)CONCAT71(in_register_00000011,verbose) != 0) {
    if (comment == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x60e730);
    }
    else {
      sVar4 = strlen(comment);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,comment,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":\n",2);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_80,command," ");
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_80._M_dataplus._M_p,local_80._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
  }
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_84 = 0;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  bVar1 = cmSystemTools::RunSingleCommand
                    (command,&local_80,&local_80,&local_84,(char *)0x0,OUTPUT_NONE,(cmDuration)0x0,
                     Auto);
  if (local_84 == 0) {
    bVar2 = true;
  }
  else if (retCodeOkay == (_func_bool_int *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = (*retCodeOkay)(local_84);
  }
  if (retCodeOut != (int *)0x0) {
    iVar3 = -1;
    if (bVar2 == false) {
      iVar3 = local_84;
    }
    if (bVar1) {
      iVar3 = local_84;
    }
    *retCodeOut = iVar3;
  }
  if ((bool)(bVar1 & bVar2) == false) {
    if (comment == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x60e730);
    }
    else {
      sVar4 = strlen(comment);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,comment,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": command \"",0xb);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_58,command," ");
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_58._M_dataplus._M_p,local_58._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" failed (exit code ",0x14);
    local_38.Format = local_5c;
    local_38.Value = local_84;
    operator<<(poVar5,&local_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,") with the following output:\n",0x1d)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_80._M_dataplus._M_p,local_80._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    lVar6 = std::__cxx11::string::find((char *)&local_80,0x4aa8e6,0);
    if (lVar6 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_80._M_dataplus._M_p,local_80._M_string_length);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  return (bool)(bVar1 & bVar2);
}

Assistant:

static bool RunCommand(const char* comment, std::vector<std::string>& command,
                       bool verbose, NumberFormat exitFormat,
                       int* retCodeOut = nullptr,
                       bool (*retCodeOkay)(int) = nullptr)
{
  if (verbose) {
    std::cout << comment << ":\n";
    std::cout << cmJoin(command, " ") << "\n";
  }
  std::string output;
  int retCode = 0;
  bool commandResult = cmSystemTools::RunSingleCommand(
    command, &output, &output, &retCode, nullptr, cmSystemTools::OUTPUT_NONE);
  bool const retCodeSuccess =
    retCode == 0 || (retCodeOkay && retCodeOkay(retCode));
  bool const success = commandResult && retCodeSuccess;
  if (retCodeOut) {
    if (commandResult || !retCodeSuccess) {
      *retCodeOut = retCode;
    } else {
      *retCodeOut = -1;
    }
  }
  if (!success) {
    std::cout << comment << ": command \"" << cmJoin(command, " ")
              << "\" failed (exit code "
              << NumberFormatter(exitFormat, retCode)
              << ") with the following output:\n"
              << output;
  } else {
    // always print the output of the command, unless
    // it is the dumb rc command banner
    if (output.find("Resource Compiler Version") == std::string::npos) {
      std::cout << output;
    }
  }
  return success;
}